

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void CCamera::ConSetPosition(IResult *pResult,void *pUserData)

{
  int iVar1;
  int iVar2;
  CCamera *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  float nx;
  int PositionNumber;
  CCamera *pSelf;
  vec2 Position;
  int in_stack_ffffffffffffffcc;
  vec2 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**(code **)(*in_RDI + 0x10))();
  iVar1 = clamp<int>(iVar1,0,9);
  iVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
  nx = (float)iVar2 * 32.0 + 16.0;
  iVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,2);
  vector2_base<float>::vector2_base(&local_10,nx,(float)iVar2 * 32.0 + 16.0);
  in_RSI->m_Positions[iVar1] = local_10;
  iVar2 = GetCurrentPosition(in_RSI);
  if (iVar2 == iVar1) {
    ChangePosition((CCamera *)CONCAT44(iVar1,nx),in_stack_ffffffffffffffcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCamera::ConSetPosition(IConsole::IResult *pResult, void *pUserData)
{
	CCamera *pSelf = (CCamera *)pUserData;
	int PositionNumber = clamp(pResult->GetInteger(0), 0, NUM_POS-1);
	vec2 Position = vec2(pResult->GetInteger(1)*32.0f+16.0f, pResult->GetInteger(2)*32.0f+16.0f);
	pSelf->m_Positions[PositionNumber] = Position;

	// update
	if(pSelf->GetCurrentPosition() == PositionNumber)
		pSelf->ChangePosition(PositionNumber);
}